

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void lodepng_info_init(LodePNGInfo *info)

{
  undefined1 auVar1 [32];
  
  (info->color).colortype = LCT_RGBA;
  (info->color).bitdepth = 8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (info->color).palette = (uchar *)auVar1._0_8_;
  (info->color).palettesize = auVar1._8_8_;
  (info->color).key_defined = auVar1._16_4_;
  (info->color).key_r = auVar1._20_4_;
  (info->color).key_g = auVar1._24_4_;
  (info->color).key_b = auVar1._28_4_;
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
  info->phys_defined = 0;
  info->gama_defined = 0;
  info->chrm_defined = 0;
  info->srgb_defined = 0;
  info->iccp_defined = 0;
  info->unknown_chunks_data[0] = (uchar *)auVar1._0_8_;
  info->unknown_chunks_data[1] = (uchar *)auVar1._8_8_;
  info->unknown_chunks_data[2] = (uchar *)auVar1._16_8_;
  info->unknown_chunks_size[0] = auVar1._24_8_;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])(info->unknown_chunks_data + 2) = auVar1;
  info->background_defined = auVar1._0_4_;
  info->background_r = auVar1._4_4_;
  info->background_g = auVar1._8_4_;
  info->background_b = auVar1._12_4_;
  info->text_num = auVar1._16_8_;
  info->text_keys = (char **)auVar1._24_8_;
  info->text_strings = (char **)auVar1._0_8_;
  info->itext_num = auVar1._8_8_;
  info->itext_keys = (char **)auVar1._16_8_;
  info->itext_langtags = (char **)auVar1._24_8_;
  *(undefined1 (*) [32])((long)&info->itext_keys + 4) = auVar1;
  info->iccp_name = (char *)0x0;
  info->iccp_profile = (uchar *)0x0;
  return;
}

Assistant:

void lodepng_color_mode_init(LodePNGColorMode* info) {
  info->key_defined = 0;
  info->key_r = info->key_g = info->key_b = 0;
  info->colortype = LCT_RGBA;
  info->bitdepth = 8;
  info->palette = 0;
  info->palettesize = 0;
}